

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool MatchMultisig(CScript *script,int *required_sigs,
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *pubkeys)

{
  long lVar1;
  const_iterator x;
  bool bVar2;
  size_type sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x;
  _Optional_payload_base<int> data_00;
  int *piVar4;
  size_type sVar5;
  int *in_RSI;
  long in_FS_OFFSET;
  const_iterator it;
  valtype data;
  opcodetype opcode;
  optional<int> num_keys;
  optional<int> req_sigs;
  undefined4 in_stack_fffffffffffffee8;
  size_type in_stack_fffffffffffffeec;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff08;
  const_iterator *in_stack_ffffffffffffff10;
  CScript *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  valtype *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff34;
  opcodetype opcode_00;
  undefined4 in_stack_ffffffffffffff40;
  bool local_79;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_fffffffffffffef0);
  sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT17(in_stack_fffffffffffffeff,
                              CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  if ((sVar3 == 0) ||
     (__x = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            prevector<28U,_unsigned_char,_unsigned_int,_int>::back
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8))),
     *(uchar *)&(__x->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start != 0xae)) {
    local_79 = false;
  }
  else {
    bVar2 = CScript::GetOp(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           (opcodetype *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    opcode_00 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff34);
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(sVar3,in_stack_ffffffffffffff40),__x);
      data_00 = (_Optional_payload_base<int>)
                GetScriptNumber(opcode_00,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                                in_stack_ffffffffffffff20);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<int> *)
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (bVar2) {
        piVar4 = std::optional<int>::operator*
                           ((optional<int> *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        *in_RSI = *piVar4;
        while( true ) {
          bVar2 = CScript::GetOp(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                 (opcodetype *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          in_stack_ffffffffffffff24 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff24) & 0xff00ffff;
          if (bVar2) {
            bVar2 = CPubKey::ValidSize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT17(in_stack_fffffffffffffeff,
                                                CONCAT16(in_stack_fffffffffffffefe,
                                                         in_stack_fffffffffffffef8)));
            in_stack_ffffffffffffff24 =
                 CONCAT13((char)(in_stack_ffffffffffffff24 >> 0x18),
                          CONCAT12(bVar2,CONCAT11(bVar2,(char)in_stack_ffffffffffffff24)));
          }
          if ((char)(in_stack_ffffffffffffff24 >> 0x10) == '\0') break;
          std::
          vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(sVar3,in_stack_ffffffffffffff40),__x);
        GetScriptNumber(opcode_00,(valtype *)data_00,in_stack_ffffffffffffff24,local_1c);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional<int> *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (bVar2) {
          sVar5 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          piVar4 = std::optional<int>::operator*
                             ((optional<int> *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          if (sVar5 == (long)*piVar4) {
            prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                      ((const_iterator *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
            prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_fffffffffffffef0);
            x.ptr._6_1_ = in_stack_fffffffffffffefe;
            x.ptr._0_6_ = in_stack_fffffffffffffef8;
            x.ptr._7_1_ = in_stack_fffffffffffffeff;
            in_stack_fffffffffffffeff =
                 prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator==
                           ((const_iterator *)in_stack_fffffffffffffef0,x);
            local_79 = (bool)in_stack_fffffffffffffeff;
          }
          else {
            local_79 = false;
          }
        }
        else {
          local_79 = false;
        }
      }
      else {
        local_79 = false;
      }
    }
    else {
      local_79 = false;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffeff,
                      CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_79;
}

Assistant:

static bool MatchMultisig(const CScript& script, int& required_sigs, std::vector<valtype>& pubkeys)
{
    opcodetype opcode;
    valtype data;

    CScript::const_iterator it = script.begin();
    if (script.size() < 1 || script.back() != OP_CHECKMULTISIG) return false;

    if (!script.GetOp(it, opcode, data)) return false;
    auto req_sigs = GetScriptNumber(opcode, data, 1, MAX_PUBKEYS_PER_MULTISIG);
    if (!req_sigs) return false;
    required_sigs = *req_sigs;
    while (script.GetOp(it, opcode, data) && CPubKey::ValidSize(data)) {
        pubkeys.emplace_back(std::move(data));
    }
    auto num_keys = GetScriptNumber(opcode, data, required_sigs, MAX_PUBKEYS_PER_MULTISIG);
    if (!num_keys) return false;
    if (pubkeys.size() != static_cast<unsigned long>(*num_keys)) return false;

    return (it + 1 == script.end());
}